

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void av1_calc_proj_params_high_bd_c
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int64_t (*H) [2],
               int64_t *C,sgr_params_type *params)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  uint8_t *in_RDI;
  uint8_t *in_R8;
  int in_R9D;
  int32_t *in_stack_00000008;
  int in_stack_00000010;
  int32_t *in_stack_00000018;
  int in_stack_00000020;
  int64_t (*in_stack_00000028) [2];
  int64_t *in_stack_00000030;
  undefined4 in_stack_00000038;
  
  if ((*(int *)CONCAT44(dat_stride,in_stack_00000038) < 1) ||
     (*(int *)(CONCAT44(dat_stride,in_stack_00000038) + 4) < 1)) {
    if (*(int *)CONCAT44(dat_stride,in_stack_00000038) < 1) {
      if (0 < *(int *)(CONCAT44(dat_stride,in_stack_00000038) + 4)) {
        calc_proj_params_r1_high_bd_c
                  (in_RDI,in_ESI,in_EDX,in_ECX,in_R8,in_R9D,in_stack_00000018,in_stack_00000020,
                   in_stack_00000028,in_stack_00000030);
      }
    }
    else {
      calc_proj_params_r0_high_bd_c
                (in_RDI,in_ESI,in_EDX,in_ECX,in_R8,in_R9D,in_stack_00000008,in_stack_00000010,
                 in_stack_00000028,in_stack_00000030);
    }
  }
  else {
    calc_proj_params_r0_r1_high_bd_c
              (in_RDI,in_ESI,in_EDX,in_ECX,in_R8,in_R9D,in_stack_00000008,in_stack_00000010,
               in_stack_00000018,in_stack_00000020,in_stack_00000028,in_stack_00000030);
  }
  return;
}

Assistant:

void av1_calc_proj_params_high_bd_c(const uint8_t *src8, int width, int height,
                                    int src_stride, const uint8_t *dat8,
                                    int dat_stride, int32_t *flt0,
                                    int flt0_stride, int32_t *flt1,
                                    int flt1_stride, int64_t H[2][2],
                                    int64_t C[2],
                                    const sgr_params_type *params) {
  if ((params->r[0] > 0) && (params->r[1] > 0)) {
    calc_proj_params_r0_r1_high_bd_c(src8, width, height, src_stride, dat8,
                                     dat_stride, flt0, flt0_stride, flt1,
                                     flt1_stride, H, C);
  } else if (params->r[0] > 0) {
    calc_proj_params_r0_high_bd_c(src8, width, height, src_stride, dat8,
                                  dat_stride, flt0, flt0_stride, H, C);
  } else if (params->r[1] > 0) {
    calc_proj_params_r1_high_bd_c(src8, width, height, src_stride, dat8,
                                  dat_stride, flt1, flt1_stride, H, C);
  }
}